

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvcc_functional_test.cc
# Opt level: O2

void * rollback_during_ops_test(void *args)

{
  fdb_kvs_handle *pfVar1;
  fdb_seqnum_t seqnum;
  fdb_status fVar2;
  size_t sVar3;
  uint uVar4;
  ulong seqnum_00;
  uint uVar5;
  char *__format;
  short sVar6;
  byte local_281;
  fdb_kvs_handle *kvs;
  fdb_file_handle *file;
  undefined4 local_26c;
  pthread_t tid;
  char str [15];
  void *thread_ret;
  fdb_kvs_config kvs_config;
  timeval __test_begin;
  fdb_kvs_info kvs_info;
  fdb_config config;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  local_26c = 10000;
  if (args != (void *)0x0) {
    fdb_get_default_config();
    memcpy(&config,&kvs_info,0xf8);
    config.block_reusing_threshold = 0;
    fVar2 = fdb_open(&file,"mvcc_test1",&config);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x134d);
      rollback_during_ops_test(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x134d,"void *rollback_during_ops_test(void *)");
    }
    fdb_get_default_kvs_config();
    kvs_config.custom_cmp_param = (void *)kvs_info.doc_count;
    kvs_config._0_8_ = kvs_info.name;
    kvs_config.custom_cmp = (fdb_custom_cmp_variable)kvs_info.last_seqnum;
    fVar2 = fdb_kvs_open_default(file,&kvs,&kvs_config);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      seqnum_00 = (ulong)*args;
      while( true ) {
        if ((int)seqnum_00 < 2) {
          fdb_close(file);
          pthread_exit((void *)0x0);
        }
        sprintf(str,"%d",seqnum_00 & 0xffffffff);
        pfVar1 = kvs;
        sVar3 = strlen(str);
        fVar2 = fdb_set_kv(pfVar1,str,sVar3,"value",5);
        if (fVar2 != FDB_RESULT_SUCCESS) break;
        if ((int)((seqnum_00 & 0xffffffff) / 10) * -10 + (int)seqnum_00 == 0) {
          fVar2 = fdb_rollback(&kvs,seqnum_00);
          if (fVar2 != FDB_RESULT_SUCCESS) {
            fprintf(_stderr,"Test failed: %s %d\n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x135a);
            rollback_during_ops_test(void*)::__test_pass = 1;
            __assert_fail("status == FDB_RESULT_SUCCESS",
                          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                          ,0x135a,"void *rollback_during_ops_test(void *)");
          }
        }
        seqnum_00 = seqnum_00 - 1;
      }
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1357);
      rollback_during_ops_test(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1357,"void *rollback_during_ops_test(void *)");
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1350);
    rollback_during_ops_test(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1350,"void *rollback_during_ops_test(void *)");
  }
  system("rm -rf  mvcc_test* > errorlog.txt");
  fdb_get_default_config();
  memcpy(&config,&kvs_info,0xf8);
  config.block_reusing_threshold = 0;
  fVar2 = fdb_open(&file,"mvcc_test1",&config);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x12fc);
    rollback_during_ops_test(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x12fc,"void *rollback_during_ops_test(void *)");
  }
  fdb_get_default_kvs_config();
  kvs_config.custom_cmp_param = (void *)kvs_info.doc_count;
  kvs_config._0_8_ = kvs_info.name;
  kvs_config.custom_cmp = (fdb_custom_cmp_variable)kvs_info.last_seqnum;
  fVar2 = fdb_kvs_open_default(file,&kvs,&kvs_config);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1301);
    rollback_during_ops_test(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1301,"void *rollback_during_ops_test(void *)");
  }
  uVar4 = 1;
  local_281 = 1;
  sVar6 = -1;
  uVar5 = 1;
  while( true ) {
    if (10000 < uVar4) break;
    sprintf(str,"%d",(ulong)uVar4);
    pfVar1 = kvs;
    sVar3 = strlen(str);
    fVar2 = fdb_set_kv(pfVar1,str,sVar3,"value",5);
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1307);
      rollback_during_ops_test(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1307,"void *rollback_during_ops_test(void *)");
    }
    if ((short)((short)((uVar5 & 0xffff) / 10) * 10 + sVar6) == 0) {
      local_281 = local_281 ^ 1;
      fdb_commit(file,local_281);
    }
    uVar4 = uVar4 + 1;
    sVar6 = sVar6 + -1;
    uVar5 = uVar5 + 1;
  }
  fdb_commit(file,'\x01');
  fdb_get_kvs_info(kvs,&kvs_info);
  if (kvs_info.last_seqnum != 10000) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1314);
    rollback_during_ops_test(void*)::__test_pass = '\x01';
    if (kvs_info.last_seqnum != 10000) {
      __assert_fail("kvs_info.last_seqnum == (uint64_t)n",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1314,"void *rollback_during_ops_test(void *)");
    }
  }
  pthread_create(&tid,(pthread_attr_t *)0x0,rollback_during_ops_test,&local_26c);
  for (uVar4 = 1; uVar4 != 0x2711; uVar4 = uVar4 + 1) {
    sprintf(str,"%d",(ulong)uVar4);
    pfVar1 = kvs;
    sVar3 = strlen(str);
    fVar2 = fdb_set_kv(pfVar1,str,sVar3,"value",5);
    if (fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) {
      if (fVar2 != FDB_RESULT_SUCCESS) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1323);
        rollback_during_ops_test(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_FAIL_BY_ROLLBACK",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1323,"void *rollback_during_ops_test(void *)");
      }
      fVar2 = fdb_commit(file,'\x01');
      if ((fVar2 != FDB_RESULT_FAIL_BY_ROLLBACK) && (fVar2 != FDB_RESULT_SUCCESS)) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1320);
        rollback_during_ops_test(void*)::__test_pass = 1;
        __assert_fail("status == FDB_RESULT_FAIL_BY_ROLLBACK",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                      ,0x1320,"void *rollback_during_ops_test(void *)");
      }
    }
  }
  pthread_join(tid,&thread_ret);
  fVar2 = fdb_set_kv(kvs,"key1",4,"value",5);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x132c);
    rollback_during_ops_test(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x132c,"void *rollback_during_ops_test(void *)");
  }
  fVar2 = fdb_commit(file,'\x01');
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x132e);
    rollback_during_ops_test(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x132e,"void *rollback_during_ops_test(void *)");
  }
  fdb_get_kvs_info(kvs,&kvs_info);
  seqnum = kvs_info.last_seqnum;
  fVar2 = fdb_set_kv(kvs,"key2",4,"value",5);
  if (fVar2 != FDB_RESULT_SUCCESS) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x1334);
    rollback_during_ops_test(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x1334,"void *rollback_during_ops_test(void *)");
  }
  fVar2 = fdb_set_kv(kvs,"key3",4,"value",5);
  if (fVar2 == FDB_RESULT_SUCCESS) {
    fVar2 = fdb_commit(file,'\x01');
    if (fVar2 != FDB_RESULT_SUCCESS) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
              ,0x1338);
      rollback_during_ops_test(void*)::__test_pass = 1;
      __assert_fail("status == FDB_RESULT_SUCCESS",
                    "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                    ,0x1338,"void *rollback_during_ops_test(void *)");
    }
    fVar2 = fdb_rollback(&kvs,seqnum);
    if (fVar2 == FDB_RESULT_SUCCESS) {
      fdb_get_kvs_info(kvs,&kvs_info);
      if (kvs_info.last_seqnum != seqnum) {
        fprintf(_stderr,"Test failed: %s %d\n",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x133e);
        rollback_during_ops_test(void*)::__test_pass = '\x01';
        if (kvs_info.last_seqnum != seqnum) {
          __assert_fail("kvs_info.last_seqnum == rollback_to",
                        "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                        ,0x133e,"void *rollback_during_ops_test(void *)");
        }
      }
      fdb_close(file);
      fdb_shutdown();
      memleak_end();
      __format = "%s PASSED\n";
      if (rollback_during_ops_test(void*)::__test_pass != '\0') {
        __format = "%s FAILED\n";
      }
      fprintf(_stderr,__format,"rollback during ops test");
      return (void *)0x0;
    }
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
            ,0x133c);
    rollback_during_ops_test(void*)::__test_pass = 1;
    __assert_fail("status == FDB_RESULT_SUCCESS",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                  ,0x133c,"void *rollback_during_ops_test(void *)");
  }
  fprintf(_stderr,"Test failed: %s %d\n",
          "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
          ,0x1336);
  rollback_during_ops_test(void*)::__test_pass = 1;
  __assert_fail("status == FDB_RESULT_SUCCESS",
                "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/functional/mvcc_functional_test.cc"
                ,0x1336,"void *rollback_during_ops_test(void *)");
}

Assistant:

void *rollback_during_ops_test(void * args)
{

    TEST_INIT();
    memleak_start();

    fdb_file_handle *file;
    fdb_kvs_handle *kvs;
    fdb_status status;
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_kvs_info kvs_info;
    fdb_seqnum_t rollback_to;
    thread_t tid;
    void *thread_ret;
    bool walflush = true;
    char str[15];
    int i, r;
    int n = 10000;

    if (args == NULL)
    { // parent

        r = system(SHELL_DEL" mvcc_test* > errorlog.txt");
        (void)r;

        // Open Database File
        config = fdb_get_default_config();
        // disable block reusing for strict rollback
        config.block_reusing_threshold = 0;
        status = fdb_open(&file, "mvcc_test1", &config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // Open KV Store
        kvs_config = fdb_get_default_kvs_config();
        status = fdb_kvs_open_default(file, &kvs, &kvs_config);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // set with commits
        for(i=1;i<=n;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
            if(i%10==0){
                walflush = !walflush;
                if(walflush){
                    fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                } else {
                    fdb_commit(file, FDB_COMMIT_NORMAL);
                }
            }
        }

        fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == (uint64_t)n);

        // start rollback thread
        thread_create(&tid, rollback_during_ops_test, (void *)&n);

        // updates with commits
        for(i=1;i<=10000;i++) {
            sprintf(str, "%d", i);
            status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
            if(status == FDB_RESULT_SUCCESS){ // set ok
                status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
                if(status != FDB_RESULT_SUCCESS){
                    TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
                }
            } else {
                TEST_CHK(status == FDB_RESULT_FAIL_BY_ROLLBACK);
            }
        }

        // join rollback thread
        thread_join(tid, &thread_ret);

        // set a keys commit and save seqnum
        status = fdb_set_kv(kvs,(void *)"key1", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        rollback_to = kvs_info.last_seqnum;

        // 2 more sets
        status = fdb_set_kv(kvs,(void *)"key2", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_set_kv(kvs,(void *)"key3", 4, (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        status = fdb_commit(file, FDB_COMMIT_MANUAL_WAL_FLUSH);
        TEST_CHK(status == FDB_RESULT_SUCCESS);

        // rollback to last saved seqnum
        status = fdb_rollback(&kvs, rollback_to);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        fdb_get_kvs_info(kvs, &kvs_info);
        TEST_CHK(kvs_info.last_seqnum == rollback_to);

        fdb_close(file);
        fdb_shutdown();

        memleak_end();
        TEST_RESULT("rollback during ops test");
        return NULL;
    }

    // open new copy of dbfile and kvs
    config = fdb_get_default_config();
    // disable block reusing for strict rollback
    config.block_reusing_threshold = 0;
    status = fdb_open(&file, "mvcc_test1", &config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);
    kvs_config = fdb_get_default_kvs_config();
    status = fdb_kvs_open_default(file, &kvs, &kvs_config);
    TEST_CHK(status == FDB_RESULT_SUCCESS);

    // reverse set with rollbacks
    n = *((int *)args);
    for(i=n;i>1;i--){
        sprintf(str, "%d", i);
        status = fdb_set_kv(kvs, str, strlen(str), (void*)"value", 5);
        TEST_CHK(status == FDB_RESULT_SUCCESS);
        if(i%10 == 0){
            status = fdb_rollback(&kvs, i);
            TEST_CHK(status == FDB_RESULT_SUCCESS);
        }
    }

    fdb_close(file);
    // exit
    thread_exit(0);
    return NULL;

}